

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void Fl_Tooltip::enter_(Fl_Widget *w)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  Fl_Group *local_20;
  Fl_Widget *tw;
  int oldy;
  int oldx;
  Fl_Widget *w_local;
  
  local_20 = (Fl_Group *)w;
  if (((w != (Fl_Widget *)0x0) &&
      (iVar1 = (*w->_vptr_Fl_Widget[8])(), CONCAT44(extraout_var,iVar1) != 0)) &&
     (uVar2 = Fl_Window::tooltip_window((Fl_Window *)w), uVar2 != 0)) {
    iVar1 = Fl_Widget::x(w);
    iVar3 = Fl_Widget::y(w);
    Fl_TooltipBox::layout((Fl_TooltipBox *)w);
    iVar4 = Fl_Widget::x(w);
    if ((iVar4 == iVar1) && (iVar1 = Fl_Widget::y(w), iVar1 == iVar3)) {
      return;
    }
  }
  while( true ) {
    if (local_20 == (Fl_Group *)0x0) {
      exit_((Fl_Widget *)0x0);
      return;
    }
    if (local_20 == (Fl_Group *)widget_) break;
    pcVar5 = Fl_Widget::tooltip(&local_20->super_Fl_Widget);
    if (pcVar5 != (char *)0x0) {
      iVar1 = Fl_Widget::w(w);
      iVar3 = Fl_Widget::h(w);
      pcVar5 = Fl_Widget::tooltip(&local_20->super_Fl_Widget);
      enter_area(w,0,0,iVar1,iVar3,pcVar5);
      return;
    }
    local_20 = Fl_Widget::parent(&local_20->super_Fl_Widget);
  }
  return;
}

Assistant:

void Fl_Tooltip::enter_(Fl_Widget* w) {
#ifdef DEBUG
  printf("Fl_Tooltip::enter_(w=%p)\n", w);
  printf("    window=%p\n", window);
#endif // DEBUG
  if (w && w->as_window() && ((Fl_Window*)w)->tooltip_window()) {
    // Fix STR #2650: if there's no better place for a tooltip window, don't move it.
    int oldx = w->x();
    int oldy = w->y();
    ((Fl_TooltipBox*)w)->layout();
    if (w->x() == oldx && w->y() == oldy) return;
  }
  // find the enclosing group with a tooltip:
  Fl_Widget* tw = w;
  for (;;) {
    if (!tw) {exit_(0); return;}
    if (tw == widget_) return;
    if (tw->tooltip()) break;
    tw = tw->parent();
  }
  enter_area(w, 0, 0, w->w(), w->h(), tw->tooltip());
}